

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFExpression.cpp
# Opt level: O0

int __thiscall
llvm::DWARFExpression::Operation::verify
          (Operation *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  bool bVar1;
  Tag TVar2;
  uint64_t uVar3;
  Operation *pOVar4;
  undefined1 local_38 [8];
  DWARFDie Die;
  uint Size;
  uint Operand;
  DWARFUnit *U_local;
  Operation *this_local;
  
  Die.Die._4_4_ = 0;
  pOVar4 = this;
  while (Die.Die._4_4_ < 2) {
    Die.Die._0_4_ = (uint)(this->Desc).Op[Die.Die._4_4_];
    pOVar4 = (Operation *)0x0;
    if ((uint)Die.Die == 0xff) break;
    if ((uint)Die.Die == 8) {
      uVar3 = DWARFUnit::getOffset((DWARFUnit *)ctx);
      _local_38 = DWARFUnit::getDIEForOffset((DWARFUnit *)ctx,uVar3 + this->Operands[Die.Die._4_4_])
      ;
      bVar1 = DWARFDie::operator_cast_to_bool((DWARFDie *)local_38);
      if ((!bVar1) || (TVar2 = DWARFDie::getTag((DWARFDie *)local_38), TVar2 != DW_TAG_base_type)) {
        this->Error = true;
        this_local._7_1_ = 0;
        goto LAB_0203cf1e;
      }
    }
    Die.Die._4_4_ = Die.Die._4_4_ + 1;
    pOVar4 = (Operation *)(ulong)Die.Die._4_4_;
  }
  this = pOVar4;
  this_local._7_1_ = 1;
LAB_0203cf1e:
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool DWARFExpression::Operation::verify(DWARFUnit *U) {

  for (unsigned Operand = 0; Operand < 2; ++Operand) {
    unsigned Size = Desc.Op[Operand];

    if (Size == Operation::SizeNA)
      break;

    if (Size == Operation::BaseTypeRef) {
      auto Die = U->getDIEForOffset(U->getOffset() + Operands[Operand]);
      if (!Die || Die.getTag() != dwarf::DW_TAG_base_type) {
        Error = true;
        return false;
      }
    }
  }

  return true;
}